

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O1

bool __thiscall ON_Light::Transform(ON_Light *this,ON_Xform *xform)

{
  double dVar1;
  ON_3dPoint local_58;
  ON_3dVector local_38;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  ON_Xform::operator*(&local_58,xform,&this->m_location);
  (this->m_location).z = local_58.z;
  (this->m_location).x = local_58.x;
  (this->m_location).y = local_58.y;
  ON_Xform::operator*((ON_3dVector *)&local_58,xform,&this->m_direction);
  dVar1 = ON_3dVector::Length((ON_3dVector *)&local_58);
  if (0.0 < dVar1) {
    (this->m_direction).z = local_58.z;
    (this->m_direction).x = local_58.x;
    (this->m_direction).y = local_58.y;
  }
  ON_Xform::operator*(&local_38,xform,&this->m_length);
  local_58.z = local_38.z;
  local_58.x = local_38.x;
  local_58.y = local_38.y;
  dVar1 = ON_3dVector::Length((ON_3dVector *)&local_58);
  if (0.0 < dVar1) {
    (this->m_length).z = local_58.z;
    (this->m_length).x = local_58.x;
    (this->m_length).y = local_58.y;
  }
  ON_Xform::operator*(&local_38,xform,&this->m_width);
  local_58.z = local_38.z;
  local_58.x = local_38.x;
  local_58.y = local_38.y;
  dVar1 = ON_3dVector::Length((ON_3dVector *)&local_58);
  if (0.0 < dVar1) {
    (this->m_width).z = local_58.z;
    (this->m_width).x = local_58.x;
    (this->m_width).y = local_58.y;
  }
  return true;
}

Assistant:

bool ON_Light::Transform( 
       const ON_Xform& xform
       )
{
  ON_3dVector v;
  double vlen;
  TransformUserData(xform);
  m_location = xform*m_location;
  
  v = xform*m_direction;
  vlen = v.Length();
  if ( vlen > 0.0 ) {
    m_direction = v;
  }
  
  v = xform*m_length;
  vlen = v.Length();
  if ( vlen > 0.0 ) {
    m_length = v;
  }
  
  v = xform*m_width;
  vlen = v.Length();
  if ( vlen > 0.0 ) {
    m_width = v;
  }
  return true;
}